

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase35::run(TestCase35 *this)

{
  size_t sVar1;
  Builder builder_00;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder builder_01;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar2;
  MessageSizeCounts MVar3;
  ReaderOptions options;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Fault f;
  MallocMessageBuilder builder;
  SegmentArrayMessageReader reader;
  undefined1 local_378 [48];
  DebugComparison<unsigned_long,_unsigned_long> local_348;
  unsigned_long local_320;
  Reader local_318;
  StructBuilder local_2f8;
  undefined8 in_stack_fffffffffffffd50;
  SegmentReader *in_stack_fffffffffffffd58;
  CapTableReader *in_stack_fffffffffffffd60;
  WirePointer *in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  StructReader local_288;
  StructReader local_258;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  WordCountN<61,_uint64_t> local_1f8;
  uint local_1f0;
  MallocMessageBuilder local_1e8;
  undefined1 local_f8 [232];
  
  MallocMessageBuilder::MallocMessageBuilder(&local_1e8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_378,&local_1e8.super_MessageBuilder);
  local_f8._16_8_ = local_378._16_8_;
  local_f8._0_8_ = local_378._0_8_;
  local_f8._8_8_ = local_378._8_8_;
  PointerBuilder::initStruct
            ((StructBuilder *)&stack0xfffffffffffffd30,(PointerBuilder *)local_f8,
             (StructSize)0x140006);
  builder_01._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffd58;
  builder_01._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffd50;
  builder_01._builder.data = in_stack_fffffffffffffd60;
  builder_01._builder.pointers = in_stack_fffffffffffffd68;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffffd70;
  builder_01._builder.pointerCount = SUB82(in_stack_fffffffffffffd70,4);
  builder_01._builder._38_2_ = SUB82(in_stack_fffffffffffffd70,6);
  initTestMessage(builder_01);
  MessageBuilder::getRootInternal((Builder *)local_378,&local_1e8.super_MessageBuilder);
  local_f8._16_8_ = local_378._16_8_;
  local_f8._0_8_ = local_378._0_8_;
  local_f8._8_8_ = local_378._8_8_;
  PointerBuilder::getStruct(&local_2f8,(PointerBuilder *)local_f8,(StructSize)0x140006,(word *)0x0);
  builder_00._builder.capTable = local_2f8.capTable;
  builder_00._builder.segment = local_2f8.segment;
  builder_00._builder.data = local_2f8.data;
  builder_00._builder.pointers = local_2f8.pointers;
  builder_00._builder.dataSize = local_2f8.dataSize;
  builder_00._builder.pointerCount = local_2f8.pointerCount;
  builder_00._builder._38_2_ = local_2f8._38_2_;
  checkTestMessage(builder_00);
  MessageBuilder::getRootInternal((Builder *)&local_348,&local_1e8.super_MessageBuilder);
  local_378._16_8_ = local_348.op.content.ptr;
  local_378._0_8_ = local_348.left;
  local_378._8_8_ = local_348.right;
  PointerBuilder::getStruct
            ((StructBuilder *)local_f8,(PointerBuilder *)local_378,(StructSize)0x140006,(word *)0x0)
  ;
  StructBuilder::asReader((StructBuilder *)local_f8);
  reader_00._reader.capTable = (CapTableReader *)uStack_220;
  reader_00._reader.segment = (SegmentReader *)local_228;
  reader_00._reader.data = (void *)local_218;
  reader_00._reader.pointers = (WirePointer *)uStack_210;
  reader_00._reader.dataSize = (undefined4)local_208;
  reader_00._reader.pointerCount = local_208._4_2_;
  reader_00._reader._38_2_ = local_208._6_2_;
  reader_00._reader._40_8_ = uStack_200;
  checkTestMessage(reader_00);
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_1e8.super_MessageBuilder);
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_f8,AVar2,options);
  MessageReader::getRootInternal((Reader *)&local_348,(MessageReader *)local_f8);
  local_378._16_8_ = local_348.op.content.ptr;
  local_378._24_8_ = local_348.op.content.size_;
  local_378._0_8_ = local_348.left;
  local_378._8_8_ = local_348.right;
  PointerReader::getStruct(&local_258,(PointerReader *)local_378,(word *)0x0);
  reader_01._reader.capTable = local_258.capTable;
  reader_01._reader.segment = local_258.segment;
  reader_01._reader.data = local_258.data;
  reader_01._reader.pointers = local_258.pointers;
  reader_01._reader.dataSize = local_258.dataSize;
  reader_01._reader.pointerCount = local_258.pointerCount;
  reader_01._reader._38_2_ = local_258._38_2_;
  reader_01._reader.nestingLimit = local_258.nestingLimit;
  reader_01._reader._44_4_ = local_258._44_4_;
  checkTestMessage(reader_01);
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_1e8.super_MessageBuilder);
  local_378._8_8_ = AVar2.size_;
  local_378._0_4_ = 1;
  local_378._16_8_ = " == ";
  local_378._24_8_ = &DAT_00000005;
  local_378[0x20] = (CapTableReader *)local_378._8_8_ == (CapTableReader *)0x1;
  if (local_378[0x20]) {
    AVar2 = MessageBuilder::getSegmentsForOutput(&local_1e8.super_MessageBuilder);
    local_378._16_8_ = (AVar2.ptr)->ptr;
    local_378._0_8_ = (SegmentBuilder *)0x0;
    local_378._8_8_ = (CapTableReader *)0x0;
    local_378._24_4_ = 0x7fffffff;
    PointerReader::getStruct(&local_288,(PointerReader *)local_378,(word *)0x0);
    reader_02._reader.capTable = local_288.capTable;
    reader_02._reader.segment = local_288.segment;
    reader_02._reader.data = local_288.data;
    reader_02._reader.pointers = local_288.pointers;
    reader_02._reader.dataSize = local_288.dataSize;
    reader_02._reader.pointerCount = local_288.pointerCount;
    reader_02._reader._38_2_ = local_288._38_2_;
    reader_02._reader.nestingLimit = local_288.nestingLimit;
    reader_02._reader._44_4_ = local_288._44_4_;
    checkTestMessage(reader_02);
    AVar2 = MessageBuilder::getSegmentsForOutput(&local_1e8.super_MessageBuilder);
    sVar1 = (AVar2.ptr)->size_;
    MessageReader::getRootInternal(&local_318,(MessageReader *)local_f8);
    PointerReader::getStruct
              ((StructReader *)local_378,(PointerReader *)&stack0xfffffffffffffd58,(word *)0x0);
    MVar3 = StructReader::totalSize((StructReader *)local_378);
    local_348.right = MVar3.wordCount;
    local_348.left = sVar1 - 1;
    local_348.op.content.ptr = " == ";
    local_348.op.content.size_ = 5;
    local_348.result = local_348.left == local_348.right;
    if ((!local_348.result) && (kj::_::Debug::minSeverity < 3)) {
      AVar2 = MessageBuilder::getSegmentsForOutput(&local_1e8.super_MessageBuilder);
      local_320 = (AVar2.ptr)->size_ - 1;
      MessageReader::getRootInternal(&local_318,(MessageReader *)local_f8);
      PointerReader::getStruct
                ((StructReader *)local_378,(PointerReader *)&stack0xfffffffffffffd58,(word *)0x0);
      MVar3 = StructReader::totalSize((StructReader *)local_378);
      local_1f8 = MVar3.wordCount;
      local_1f0 = MVar3.capCount;
      kj::_::Debug::
      log<char_const(&)[122],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x33,ERROR,
                 "\"failed: expected \" \"(builder.getSegmentsForOutput()[0].size() - 1) == (reader.getRoot<TestAllTypes>().totalSize().wordCount)\", _kjCondition, builder.getSegmentsForOutput()[0].size() - 1, reader.getRoot<TestAllTypes>().totalSize().wordCount"
                 ,(char (*) [122])
                  "failed: expected (builder.getSegmentsForOutput()[0].size() - 1) == (reader.getRoot<TestAllTypes>().totalSize().wordCount)"
                 ,&local_348,&local_320,&local_1f8);
    }
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_f8);
    MallocMessageBuilder::~MallocMessageBuilder(&local_1e8);
    return;
  }
  local_318.reader.segment._0_4_ = 1;
  MessageBuilder::getSegmentsForOutput(&local_1e8.super_MessageBuilder);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            ((Fault *)&local_348,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x2e,FAILED,"(1u) == (builder.getSegmentsForOutput().size())",
             "_kjCondition,1u, builder.getSegmentsForOutput().size()",
             (DebugComparison<unsigned_int,_unsigned_long> *)local_378,(uint *)&local_318,
             (unsigned_long *)&stack0xfffffffffffffd58);
  kj::_::Debug::Fault::fatal((Fault *)&local_348);
}

Assistant:

TEST(Encoding, AllTypes) {
  MallocMessageBuilder builder;

  initTestMessage(builder.initRoot<TestAllTypes>());
  checkTestMessage(builder.getRoot<TestAllTypes>());
  checkTestMessage(builder.getRoot<TestAllTypes>().asReader());

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());

  checkTestMessage(reader.getRoot<TestAllTypes>());

  ASSERT_EQ(1u, builder.getSegmentsForOutput().size());

  checkTestMessage(readMessageUnchecked<TestAllTypes>(builder.getSegmentsForOutput()[0].begin()));

  EXPECT_EQ(builder.getSegmentsForOutput()[0].size() - 1,  // -1 for root pointer
            reader.getRoot<TestAllTypes>().totalSize().wordCount);
}